

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  undefined8 uVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ImVec2 *pIVar10;
  uint uVar11;
  ImDrawVert *pIVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  uint *puVar17;
  undefined7 in_register_00000081;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float afStack_88 [2];
  undefined8 uStack_80;
  ImVec2 IStack_78;
  undefined8 local_70;
  float local_68 [4];
  ulong local_58;
  int local_4c;
  ImVec2 local_48;
  uint local_3c;
  ulong local_38;
  
  if (points_count < 2) {
    return;
  }
  IVar5 = this->_Data->TexUvWhitePixel;
  local_58 = (ulong)(points_count - 1U);
  local_38 = (ulong)(points_count - 1U);
  if (closed) {
    local_38 = (ulong)(uint)points_count;
  }
  iVar16 = (int)local_38;
  local_68[0] = thickness;
  if ((this->Flags & 1) == 0) {
    uStack_80 = 0x166a8b;
    PrimReserve(this,iVar16 * 6,iVar16 * 4);
    uVar13 = 1;
    do {
      uVar8 = uVar13 & 0xffffffff;
      if ((uint)points_count == uVar13) {
        uVar8 = 0;
      }
      fVar25 = points[uVar13 - 1].x;
      fVar29 = points[uVar13 - 1].y;
      fVar23 = points[uVar8].x - fVar25;
      fVar26 = points[uVar8].y - fVar29;
      fVar24 = fVar23 * fVar23 + fVar26 * fVar26;
      if (0.0 < fVar24) {
        fVar24 = 1.0 / SQRT(fVar24);
        fVar26 = fVar26 * fVar24;
        fVar23 = fVar23 * fVar24;
      }
      fVar26 = fVar26 * local_68[0] * 0.5;
      fVar23 = fVar23 * local_68[0] * 0.5;
      pIVar12 = this->_VtxWritePtr;
      IVar6.y = fVar29 - fVar23;
      IVar6.x = fVar25 + fVar26;
      pIVar12->pos = IVar6;
      pIVar12->uv = IVar5;
      pIVar12 = this->_VtxWritePtr;
      pIVar12->col = col;
      pIVar12[1].pos.x = points[uVar8].x + fVar26;
      pIVar12[1].pos.y = points[uVar8].y - fVar23;
      pIVar12[1].uv = IVar5;
      pIVar12 = this->_VtxWritePtr;
      pIVar12[1].col = col;
      pIVar12[2].pos.x = points[uVar8].x - fVar26;
      pIVar12[2].pos.y = points[uVar8].y + fVar23;
      pIVar12[2].uv = IVar5;
      pIVar12 = this->_VtxWritePtr;
      pIVar12[2].col = col;
      pIVar12[3].pos.x = points[uVar13 - 1].x - fVar26;
      pIVar12[3].pos.y = points[uVar13 - 1].y + fVar23;
      pIVar12[3].uv = IVar5;
      pIVar12 = this->_VtxWritePtr;
      pIVar12[3].col = col;
      this->_VtxWritePtr = pIVar12 + 4;
      uVar20 = this->_VtxCurrentIdx;
      puVar17 = this->_IdxWritePtr;
      *puVar17 = uVar20;
      puVar17[1] = uVar20 + 1;
      puVar17[2] = this->_VtxCurrentIdx + 2;
      uVar20 = this->_VtxCurrentIdx;
      puVar17[3] = uVar20;
      puVar17[4] = uVar20 + 2;
      puVar17[5] = this->_VtxCurrentIdx + 3;
      this->_IdxWritePtr = puVar17 + 6;
      this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
      bVar22 = uVar13 != (local_38 & 0xffffffff);
      uVar13 = uVar13 + 1;
    } while (bVar22);
    return;
  }
  local_48.x = (float)(int)CONCAT71(in_register_00000081,closed);
  local_3c = col & 0xffffff;
  local_70 = (ulong)(1.0 < thickness);
  iVar14 = 0xc;
  if (1.0 < thickness) {
    iVar14 = 0x12;
  }
  local_4c = points_count * 3;
  if (1.0 < thickness) {
    local_4c = points_count * 4;
  }
  uStack_80 = 0x166c62;
  PrimReserve(this,iVar14 * iVar16,local_4c);
  lVar7 = -((ulong)(uint)(((int)local_70 * 2 + 3) * points_count) * 8 + 0xf & 0xfffffffffffffff0);
  puVar9 = (undefined8 *)((long)&IStack_78 + lVar7);
  uVar8 = (ulong)(uint)points_count;
  pfVar2 = (float *)(puVar9 + uVar8);
  uVar15 = local_38 & 0xffffffff;
  uVar13 = 1;
  do {
    uVar18 = uVar13 & 0xffffffff;
    if (uVar8 == uVar13) {
      uVar18 = 0;
    }
    fVar26 = points[uVar18].x - points[uVar13 - 1].x;
    fVar23 = points[uVar18].y - points[uVar13 - 1].y;
    fVar25 = fVar26 * fVar26 + fVar23 * fVar23;
    if (0.0 < fVar25) {
      fVar25 = 1.0 / SQRT(fVar25);
      fVar26 = fVar26 * fVar25;
      fVar23 = fVar23 * fVar25;
    }
    *(float *)((long)&uStack_80 + uVar13 * 8 + lVar7) = fVar23;
    *(float *)((long)&uStack_80 + uVar13 * 8 + lVar7 + 4) = -fVar26;
    bVar22 = uVar13 != uVar15;
    uVar13 = uVar13 + 1;
  } while (bVar22);
  if (local_48.x._0_1_ == '\0') {
    *(undefined8 *)(pfVar2 + -2) = *(undefined8 *)(pfVar2 + -4);
    if (local_68[0] <= 1.0) {
      fVar26 = (float)*puVar9;
      fVar23 = (float)((ulong)*puVar9 >> 0x20);
      fVar25 = (*points).x;
      fVar29 = (*points).y;
      *pfVar2 = fVar26 + fVar25;
      pfVar2[1] = fVar23 + fVar29;
      pfVar2[2] = fVar25 - fVar26;
      pfVar2[3] = fVar29 - fVar23;
      uVar13 = local_58 & 0xffffffff;
      fVar26 = points[uVar13].x;
      fVar23 = points[uVar13].y;
      uVar18 = (ulong)(uint)((int)local_58 * 2);
      *(ulong *)(pfVar2 + uVar18 * 2) =
           CONCAT44((float)((ulong)puVar9[uVar13] >> 0x20) + fVar23,(float)puVar9[uVar13] + fVar26);
      *(ulong *)(pfVar2 + uVar18 * 2 + 2) =
           CONCAT44(fVar23 - (float)((ulong)puVar9[uVar13] >> 0x20),fVar26 - (float)puVar9[uVar13]);
      goto LAB_00167034;
    }
    local_48 = IVar5;
    local_38 = CONCAT44(local_38._4_4_,col);
    fVar30 = (local_68[0] + -1.0) * 0.5;
    fVar26 = fVar30 + 1.0;
    fVar23 = (float)*puVar9;
    fVar25 = (float)((ulong)*puVar9 >> 0x20);
    fVar29 = fVar23 * fVar26;
    fVar24 = fVar25 * fVar26;
    fVar27 = (*points).x;
    fVar28 = (*points).y;
    fVar23 = fVar23 * fVar30;
    fVar25 = fVar25 * fVar30;
    *pfVar2 = fVar29 + fVar27;
    pfVar2[1] = fVar24 + fVar28;
    pfVar2[2] = fVar23 + fVar27;
    pfVar2[3] = fVar25 + fVar28;
    pfVar2[4] = fVar27 - fVar23;
    pfVar2[5] = fVar28 - fVar25;
    pfVar2[6] = fVar27 - fVar29;
    pfVar2[7] = fVar28 - fVar24;
    uVar13 = local_58 & 0xffffffff;
    fVar23 = points[uVar13].x;
    fVar25 = points[uVar13].y;
    uVar18 = (ulong)(uint)((int)local_58 << 2);
    *(ulong *)(pfVar2 + uVar18 * 2) =
         CONCAT44((float)((ulong)puVar9[uVar13] >> 0x20) * fVar26 + fVar25,
                  (float)puVar9[uVar13] * fVar26 + fVar23);
    *(ulong *)(pfVar2 + uVar18 * 2 + 2) =
         CONCAT44((float)((ulong)puVar9[uVar13] >> 0x20) * fVar30 + fVar25,
                  (float)puVar9[uVar13] * fVar30 + fVar23);
    *(ulong *)(pfVar2 + uVar18 * 2 + 4) =
         CONCAT44(fVar25 - (float)((ulong)puVar9[uVar13] >> 0x20) * fVar30,
                  fVar23 - (float)puVar9[uVar13] * fVar30);
    *(ulong *)(pfVar2 + uVar18 * 2 + 6) =
         CONCAT44(fVar25 - (float)((ulong)puVar9[uVar13] >> 0x20) * fVar26,
                  fVar23 - (float)puVar9[uVar13] * fVar26);
  }
  else {
    if (local_68[0] <= 1.0) {
LAB_00167034:
      puVar17 = this->_IdxWritePtr;
      uVar13 = 1;
      uVar20 = this->_VtxCurrentIdx;
      do {
        uVar18 = uVar13 & 0xffffffff;
        if (uVar8 == uVar13) {
          uVar18 = 0;
        }
        uVar4 = *(undefined8 *)((long)&uStack_80 + uVar13 * 8 + lVar7);
        fVar26 = ((float)puVar9[uVar18] + (float)uVar4) * 0.5;
        fVar23 = ((float)((ulong)puVar9[uVar18] >> 0x20) + (float)((ulong)uVar4 >> 0x20)) * 0.5;
        fVar25 = fVar26 * fVar26 + fVar23 * fVar23;
        uVar21 = uVar20 + 3;
        if (uVar8 == uVar13) {
          uVar21 = this->_VtxCurrentIdx;
        }
        fVar29 = 0.5;
        if (0.5 <= fVar25) {
          fVar29 = fVar25;
        }
        fVar25 = points[uVar18].x;
        fVar24 = points[uVar18].y;
        fVar26 = (1.0 / fVar29) * fVar26;
        fVar23 = (1.0 / fVar29) * fVar23;
        pfVar3 = pfVar2 + (ulong)(uint)((int)uVar18 * 2) * 2;
        *pfVar3 = fVar26 + fVar25;
        pfVar3[1] = fVar23 + fVar24;
        pfVar3[2] = fVar25 - fVar26;
        pfVar3[3] = fVar24 - fVar23;
        *puVar17 = uVar21;
        puVar17[1] = uVar20;
        puVar17[2] = uVar20 + 2;
        puVar17[3] = uVar20 + 2;
        puVar17[4] = uVar21 + 2;
        puVar17[5] = uVar21;
        puVar17[6] = uVar21 + 1;
        puVar17[7] = uVar20 + 1;
        puVar17[8] = uVar20;
        puVar17[9] = uVar20;
        puVar17[10] = uVar21;
        puVar17[0xb] = uVar21 + 1;
        puVar17 = puVar17 + 0xc;
        bVar22 = uVar13 != uVar15;
        uVar13 = uVar13 + 1;
        uVar20 = uVar21;
      } while (bVar22);
      this->_IdxWritePtr = puVar17;
      pIVar12 = this->_VtxWritePtr;
      pIVar10 = (ImVec2 *)(puVar9 + uVar8 + 1);
      uVar13 = 0;
      do {
        pIVar12->pos = points[uVar13];
        this->_VtxWritePtr->uv = IVar5;
        pIVar12 = this->_VtxWritePtr;
        pIVar12->col = col;
        pIVar12[1].pos = pIVar10[-1];
        this->_VtxWritePtr[1].uv = IVar5;
        pIVar12 = this->_VtxWritePtr;
        pIVar12[1].col = local_3c;
        pIVar12[2].pos = *pIVar10;
        this->_VtxWritePtr[2].uv = IVar5;
        pIVar12 = this->_VtxWritePtr;
        pIVar12[2].col = local_3c;
        pIVar12 = pIVar12 + 3;
        this->_VtxWritePtr = pIVar12;
        uVar13 = uVar13 + 1;
        pIVar10 = pIVar10 + 2;
      } while (uVar8 != uVar13);
      goto LAB_00167191;
    }
    local_48 = IVar5;
    local_38 = CONCAT44(local_38._4_4_,col);
    fVar30 = (local_68[0] + -1.0) * 0.5;
  }
  puVar17 = this->_IdxWritePtr;
  uVar13 = 1;
  uVar20 = this->_VtxCurrentIdx;
  do {
    uVar18 = uVar13 & 0xffffffff;
    if (uVar8 == uVar13) {
      uVar18 = 0;
    }
    uVar4 = *(undefined8 *)((long)&uStack_80 + uVar13 * 8 + lVar7);
    fVar23 = ((float)puVar9[uVar18] + (float)uVar4) * 0.5;
    fVar25 = ((float)((ulong)puVar9[uVar18] >> 0x20) + (float)((ulong)uVar4 >> 0x20)) * 0.5;
    fVar29 = fVar23 * fVar23 + fVar25 * fVar25;
    fVar26 = 0.5;
    if (0.5 <= fVar29) {
      fVar26 = fVar29;
    }
    uVar21 = uVar20 + 4;
    if (uVar8 == uVar13) {
      uVar21 = this->_VtxCurrentIdx;
    }
    fVar26 = 1.0 / fVar26;
    fVar27 = points[uVar18].x;
    fVar28 = points[uVar18].y;
    fVar29 = fVar23 * fVar26 * (fVar30 + 1.0);
    fVar24 = fVar25 * fVar26 * (fVar30 + 1.0);
    fVar23 = fVar23 * fVar26 * fVar30;
    fVar26 = fVar25 * fVar26 * fVar30;
    uVar18 = (ulong)(uint)((int)uVar18 << 2);
    pfVar3 = pfVar2 + uVar18 * 2;
    *pfVar3 = fVar27 + fVar29;
    pfVar3[1] = fVar28 + fVar24;
    pfVar3[2] = fVar27 + fVar23;
    pfVar3[3] = fVar28 + fVar26;
    uVar19 = uVar21 + 1;
    pfVar3 = pfVar2 + uVar18 * 2 + 4;
    *pfVar3 = fVar27 - fVar23;
    pfVar3[1] = fVar28 - fVar26;
    pfVar3[2] = fVar27 - fVar29;
    pfVar3[3] = fVar28 - fVar24;
    *puVar17 = uVar19;
    uVar1 = uVar20 + 2;
    puVar17[1] = uVar20 + 1;
    puVar17[2] = uVar1;
    puVar17[3] = uVar1;
    uVar11 = uVar21 + 2;
    puVar17[4] = uVar11;
    puVar17[5] = uVar19;
    puVar17[6] = uVar19;
    puVar17[7] = uVar20 + 1;
    puVar17[8] = uVar20;
    puVar17[9] = uVar20;
    puVar17[10] = uVar21;
    puVar17[0xb] = uVar19;
    puVar17[0xc] = uVar11;
    puVar17[0xd] = uVar1;
    puVar17[0xe] = uVar20 + 3;
    puVar17[0xf] = uVar20 + 3;
    puVar17[0x10] = uVar21 + 3;
    puVar17[0x11] = uVar11;
    puVar17 = puVar17 + 0x12;
    bVar22 = uVar13 != uVar15;
    uVar13 = uVar13 + 1;
    uVar20 = uVar21;
  } while (bVar22);
  this->_IdxWritePtr = puVar17;
  pIVar12 = this->_VtxWritePtr;
  pIVar10 = (ImVec2 *)(puVar9 + uVar8 + 3);
  do {
    pIVar12->pos = pIVar10[-3];
    this->_VtxWritePtr->uv = local_48;
    pIVar12 = this->_VtxWritePtr;
    pIVar12->col = local_3c;
    pIVar12[1].pos = pIVar10[-2];
    this->_VtxWritePtr[1].uv = local_48;
    pIVar12 = this->_VtxWritePtr;
    pIVar12[1].col = (ImU32)local_38;
    pIVar12[2].pos = pIVar10[-1];
    this->_VtxWritePtr[2].uv = local_48;
    pIVar12 = this->_VtxWritePtr;
    pIVar12[2].col = (ImU32)local_38;
    pIVar12[3].pos = *pIVar10;
    this->_VtxWritePtr[3].uv = local_48;
    pIVar12 = this->_VtxWritePtr;
    pIVar12[3].col = local_3c;
    pIVar12 = pIVar12 + 4;
    this->_VtxWritePtr = pIVar12;
    pIVar10 = pIVar10 + 4;
    uVar8 = uVar8 - 1;
  } while (uVar8 != 0);
LAB_00167191:
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + local_4c;
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    int count = points_count;
    if (!closed)
        count = points_count-1;

    const bool thick_line = (thickness > 1.0f);
    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        const int idx_count = thick_line ? count*18 : count*12;
        const int vtx_count = thick_line ? points_count*4 : points_count*3;
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * (thick_line ? 5 : 3) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count-1] = temp_normals[points_count-2];

        if (!thick_line)
        {
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * AA_SIZE;
                temp_points[1] = points[0] - temp_normals[0] * AA_SIZE;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * AA_SIZE;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * AA_SIZE;
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1+1) == points_count ? 0 : i1+1;
                unsigned int idx2 = (i1+1) == points_count ? _VtxCurrentIdx : idx1+3;

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= AA_SIZE;
                dm_y *= AA_SIZE;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2*2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                // Add indexes
                _IdxWritePtr[0] = (ImDrawIdx)(idx2+0); _IdxWritePtr[1] = (ImDrawIdx)(idx1+0); _IdxWritePtr[2] = (ImDrawIdx)(idx1+2);
                _IdxWritePtr[3] = (ImDrawIdx)(idx1+2); _IdxWritePtr[4] = (ImDrawIdx)(idx2+2); _IdxWritePtr[5] = (ImDrawIdx)(idx2+0);
                _IdxWritePtr[6] = (ImDrawIdx)(idx2+1); _IdxWritePtr[7] = (ImDrawIdx)(idx1+1); _IdxWritePtr[8] = (ImDrawIdx)(idx1+0);
                _IdxWritePtr[9] = (ImDrawIdx)(idx1+0); _IdxWritePtr[10]= (ImDrawIdx)(idx2+0); _IdxWritePtr[11]= (ImDrawIdx)(idx2+1);
                _IdxWritePtr += 12;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = points[i];          _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
                _VtxWritePtr[1].pos = temp_points[i*2+0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans;
                _VtxWritePtr[2].pos = temp_points[i*2+1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr += 3;
            }
        }
        else
        {
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx;
            for (int i1 = 0; i1 < count; i1++)
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2*4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Stroke
        const int idx_count = count*6;
        const int vtx_count = count*4;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}